

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O3

value hello_world_class_impl_interface_static_get(klass cls,class_impl impl,accessor_type *accessor)

{
  char cVar1;
  char *pcVar2;
  value pvVar3;
  
  pcVar2 = (char *)attribute_name((accessor->data).key);
  if (pcVar2 != (char *)0x0) {
    cVar1 = *pcVar2;
    if (cVar1 == 'c') {
      if (pcVar2[1] == '\0') {
        pvVar3 = (value)value_create_string((long)impl + 8,9);
        return pvVar3;
      }
    }
    else if (cVar1 == 'b') {
      if (pcVar2[1] == '\0') {
        pvVar3 = (value)value_create_float(*(undefined4 *)((long)impl + 4));
        return pvVar3;
      }
    }
    else if ((cVar1 == 'a') && (pcVar2[1] == '\0')) {
      pvVar3 = (value)value_create_int(*impl);
      return pvVar3;
    }
  }
  return (value)0x0;
}

Assistant:

value hello_world_class_impl_interface_static_get(klass cls, class_impl impl, struct accessor_type *accessor)
{
	hello_world_class hello_world = (hello_world_class)impl;
	attribute attr = accessor->data.attr;
	char *key = attribute_name(attr);

	(void)cls;

	if (key == NULL)
	{
		return NULL;
	}

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "a") == 0)
	{
		return value_create_int(hello_world->a);
	}
	else if (strcmp(key, "b") == 0)
	{
		return value_create_float(hello_world->b);
	}
	else if (strcmp(key, "c") == 0)
	{
		return value_create_string(hello_world->c, 9);
	}

	return NULL;
}